

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O1

matrix4d * __thiscall
tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
          (matrix4d *__return_storage_ptr__,value *this,matrix4d *m,matrix4d *n)

{
  size_t j;
  long lVar1;
  double *pdVar2;
  size_t i;
  long lVar3;
  long lVar4;
  double value;
  double dVar5;
  
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  lVar1 = 0;
  do {
    lVar3 = 0;
    pdVar2 = (double *)m;
    do {
      dVar5 = 0.0;
      lVar4 = 0;
      do {
        dVar5 = dVar5 + *(double *)(this + lVar4) * *(double *)((long)pdVar2 + lVar4 * 4);
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x20);
      __return_storage_ptr__->m[lVar1][lVar3] = dVar5;
      lVar3 = lVar3 + 1;
      pdVar2 = pdVar2 + 1;
    } while (lVar3 != 4);
    lVar1 = lVar1 + 1;
    this = this + 0x20;
  } while (lVar1 != 4);
  return __return_storage_ptr__;
}

Assistant:

MTy Mult(const MTy &m, const MTy &n) {
  MTy ret;
  //memset(ret.m, 0, sizeof(MTy)); 

  for (size_t j = 0; j < N; j++) {
    for (size_t i = 0; i < N; i++) {
      STy value = static_cast<STy>(0);
      for (size_t k = 0; k < N; k++) {
        value += m.m[j][k] * n.m[k][i];
      }
      ret.m[j][i] = value;
    }
  }

  return ret;
}